

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

int nsc_lookup_cb(lws_cache_nscookiejar_t *cache,void *opaque,int flags,char *buf,size_t size)

{
  long *plVar1;
  int iVar2;
  size_t sVar3;
  undefined8 *puVar4;
  int iVar5;
  lws_usec_t expiry;
  char tag [200];
  
  if ((flags & 1U) == 0) {
    iVar5 = 0;
    if (*(long *)((long)opaque + 0x10) != 0) {
      plVar1 = (long *)(*(long *)((long)opaque + 0x10) + 0x20);
      *plVar1 = *plVar1 + size;
    }
  }
  else {
    *(undefined8 *)((long)opaque + 0x10) = 0;
    iVar2 = nsc_line_to_tag(buf,size,tag,200,&expiry);
    iVar5 = 0;
    if (iVar2 == 0) {
      iVar2 = lws_cache_nscookiejar_tag_match((lws_cache_ttl_lru *)buf,*opaque,tag,'\x01');
      if (iVar2 == 0) {
        sVar3 = strlen(tag);
        iVar5 = 0;
        puVar4 = (undefined8 *)lws_realloc((void *)0x0,(sVar3 & 0xffffffff) + 0x31,"nsc_lookup_cb");
        *(undefined8 **)((long)opaque + 0x10) = puVar4;
        if (puVar4 == (undefined8 *)0x0) {
          iVar5 = -1;
        }
        else {
          puVar4[4] = size;
          puVar4[5] = (long)(int)sVar3;
          puVar4[3] = expiry;
          puVar4[2] = 0;
          *puVar4 = 0;
          puVar4[1] = 0;
          memcpy((void *)(*(long *)((long)opaque + 0x10) + 0x30),tag,(long)(int)sVar3 + 1);
          lws_dll2_add_tail(*(lws_dll2 **)((long)opaque + 0x10),
                            *(lws_dll2_owner **)((long)opaque + 8));
        }
      }
    }
  }
  return iVar5;
}

Assistant:

static int
nsc_lookup_cb(lws_cache_nscookiejar_t *cache, void *opaque, int flags,
	      const char *buf, size_t size)
{
	struct nsc_lookup_ctx *ctx = (struct nsc_lookup_ctx *)opaque;
	lws_usec_t expiry;
	char tag[200];
	int tl;

	if (!(flags & LCN_SOL)) {
		if (ctx->match)
			ctx->match->payload_size += size;

		return NIR_CONTINUE;
	}

	/*
	 * There should be enough in buf to match or reject it... let's
	 * synthesize a tag from the text "line" and then check the tags for
	 * a match
	 */

	ctx->match = NULL; /* new SOL means stop tracking payload len */

	if (nsc_line_to_tag(buf, size, tag, sizeof(tag), &expiry))
		return NIR_CONTINUE;

	if (lws_cache_nscookiejar_tag_match(&cache->cache,
					    ctx->wildcard_key, tag, 1))
		return NIR_CONTINUE;

	tl = (int)strlen(tag);

	/*
	 * ... it looks like a match then... create new match
	 * object with the specific tag, and add it to the owner list
	 */

	ctx->match = lws_fi(&cache->cache.info.cx->fic, "cache_lookup_oom") ? NULL :
			lws_malloc(sizeof(*ctx->match) + (unsigned int)tl + 1u,
				__func__);
	if (!ctx->match)
		/* caller of lookup will clean results list on fail */
		return NIR_FINISH_ERROR;

	ctx->match->payload_size = size;
	ctx->match->tag_size = (size_t)tl;
	ctx->match->expiry = expiry;

	memset(&ctx->match->list, 0, sizeof(ctx->match->list));
	memcpy(&ctx->match[1], tag, (size_t)tl + 1u);
	lws_dll2_add_tail(&ctx->match->list, ctx->results_owner);

	return NIR_CONTINUE;
}